

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  Location loc;
  size_t i;
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  string expected_str;
  Token token;
  string local_50;
  
  GetToken(&token,this);
  Consume(&token,this);
  expected_str._M_dataplus._M_p = (pointer)&expected_str.field_2;
  expected_str._M_string_length = 0;
  expected_str.field_2._M_local_buf[0] = '\0';
  if ((expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (expected->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::assign((char *)&expected_str);
    for (uVar1 = 0;
        uVar1 < (ulong)((long)(expected->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(expected->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)&expected_str);
      }
      std::__cxx11::string::append((string *)&expected_str);
    }
    if (example != (char *)0x0) {
      std::__cxx11::string::append((char *)&expected_str);
      std::__cxx11::string::append((char *)&expected_str);
      std::__cxx11::string::append((char *)&expected_str);
    }
  }
  Token::to_string_clamp_abi_cxx11_(&local_50,&token,0x50);
  uStack_d0 = SUB84(token.loc.filename._M_str,0);
  uStack_cc = (undefined4)((ulong)token.loc.filename._M_str >> 0x20);
  local_c8 = token.loc.field_1._0_4_;
  uStack_c4 = token.loc.field_1._4_4_;
  uStack_c0 = (undefined4)token.loc.field_1._8_8_;
  uStack_bc = (undefined4)((ulong)token.loc.field_1._8_8_ >> 0x20);
  loc.filename._M_str._0_4_ = uStack_d0;
  loc.filename._M_len = token.loc.filename._M_len;
  loc.filename._M_str._4_4_ = uStack_cc;
  loc.field_1.field_0.line = local_c8;
  loc.field_1.field_0.first_column = uStack_c4;
  loc.field_1.field_0.last_column = uStack_c0;
  loc.field_1._12_4_ = uStack_bc;
  Error(this,loc,"unexpected token \"%s\"%s.",local_50._M_dataplus._M_p,
        expected_str._M_dataplus._M_p,in_R8,in_R9);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)Error;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  GetToken();
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}